

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

void __thiscall llvm::Triple::getOSVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  int iVar1;
  ulong __n;
  StringRef Name;
  StringRef SVar3;
  int *__s1;
  ulong uVar2;
  
  Name = getOSName(this);
  uVar2 = Name.Length;
  __s1 = (int *)Name.Data;
  SVar3 = getOSTypeName(this->OS);
  __n = SVar3.Length;
  if ((uVar2 < __n) || ((__n != 0 && (iVar1 = bcmp(__s1,SVar3.Data,__n), iVar1 != 0)))) {
    if ((4 < uVar2 && this->OS == MacOSX) && ((char)__s1[1] == 's' && *__s1 == 0x6f63616d)) {
      Name.Length = uVar2 - 5;
      Name.Data = (char *)((long)__s1 + 5);
    }
  }
  else {
    Name.Length = uVar2 - __n;
    Name.Data = (char *)((long)__s1 + __n);
  }
  parseVersionFromName(Name,Major,Minor,Micro);
  return;
}

Assistant:

void Triple::getOSVersion(unsigned &Major, unsigned &Minor,
                          unsigned &Micro) const {
  StringRef OSName = getOSName();
  // Assume that the OS portion of the triple starts with the canonical name.
  StringRef OSTypeName = getOSTypeName(getOS());
  if (OSName.startswith(OSTypeName))
    OSName = OSName.substr(OSTypeName.size());
  else if (getOS() == MacOSX)
    OSName.consume_front("macos");

  parseVersionFromName(OSName, Major, Minor, Micro);
}